

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectbox.hpp
# Opt level: O3

void __thiscall
obx::Tree::putAsync(Tree *this,char *path,void *data,size_t size,OBXPropertyType type,void *metadata
                   ,size_t metadata_size,OBXPutMode dataPutMode,
                   function<void_(const_obx::AsyncTreePutResult_&)> callback)

{
  long lVar1;
  undefined8 uVar2;
  int err;
  undefined8 *puVar3;
  undefined4 in_register_00000084;
  ulong uVar4;
  code *pcVar5;
  
  uVar4 = CONCAT44(in_register_00000084,type);
  lVar1 = *(long *)(callback.super__Function_base._M_functor._M_unused._M_function_pointer + 0x10);
  if (lVar1 == 0) {
    pcVar5 = (code *)0x0;
    puVar3 = (undefined8 *)0x0;
  }
  else {
    puVar3 = (undefined8 *)operator_new(0x20);
    uVar4 = (ulong)type;
    puVar3[3] = *(undefined8 *)
                 (callback.super__Function_base._M_functor._M_unused._M_function_pointer + 0x18);
    uVar2 = *(undefined8 *)
             (callback.super__Function_base._M_functor._M_unused._M_function_pointer + 8);
    *puVar3 = *callback.super__Function_base._M_functor._M_unused._M_object;
    puVar3[1] = uVar2;
    puVar3[2] = lVar1;
    *(undefined8 *)(callback.super__Function_base._M_functor._M_unused._M_function_pointer + 0x10) =
         0;
    *(undefined8 *)(callback.super__Function_base._M_functor._M_unused._M_function_pointer + 0x18) =
         0;
    pcVar5 = anon_unknown_3::cCallbackTrampolineAsyncTreePut;
  }
  err = obx_tree_async_put_raw
                  (*(undefined8 *)this,path,data,size,uVar4,metadata,metadata_size,dataPutMode,
                   pcVar5,puVar3);
  if (err == 0) {
    return;
  }
  internal::throwLastError(err,(char *)0x0);
}

Assistant:

void Tree::putAsync(const char* path, void* data, size_t size, OBXPropertyType type, void* metadata,
                    size_t metadata_size, OBXPutMode dataPutMode,
                    std::function<void(const AsyncTreePutResult& result)> callback) {
    bool hasCallback = callback != nullptr;
    auto funPtr = hasCallback ? new std::function<void(const AsyncTreePutResult&)>(std::move(callback)) : nullptr;
    obx_tree_async_put_callback* cCallback = hasCallback ? cCallbackTrampolineAsyncTreePut : nullptr;
    obx_err err =
        obx_tree_async_put_raw(cTree_, path, data, size, type, metadata, metadata_size, dataPutMode, cCallback, funPtr);
    internal::checkErrOrThrow(err);
}